

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  Option *pOVar1;
  vector<CLI::Option_*,_std::allocator<CLI::Option_*>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pcVar4;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var5;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var6;
  Option *pOVar7;
  pointer psVar8;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar9;
  element_type *peVar10;
  undefined8 uVar11;
  App *pAVar12;
  bool bVar13;
  type_conflict tVar14;
  Classifier CVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  Option_p *opt;
  HorribleError *pHVar20;
  long *plVar21;
  pointer puVar22;
  undefined8 *puVar23;
  pointer psVar24;
  ArgumentMismatch *pAVar25;
  ulong *puVar26;
  undefined7 in_register_00000011;
  ulong uVar27;
  uint uVar28;
  undefined8 uVar29;
  long lVar30;
  byte bVar31;
  App *pAVar32;
  int t;
  string nvalue;
  App *sub;
  string dummy2;
  string arg_name;
  string rest;
  string current;
  string value;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_3f8;
  undefined1 local_3e8 [32];
  App *local_3c8;
  undefined1 local_3c0 [36];
  int local_39c;
  App *local_398;
  string local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  string local_350;
  _Alloc_hider local_330;
  long local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320;
  int local_30c;
  string local_308;
  string local_2e8;
  undefined1 *local_2c8;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_2c0;
  string local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  _Any_data local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  Classifier local_158;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  pcVar4 = pbVar3[-1]._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_308,pcVar4,pcVar4 + pbVar3[-1]._M_string_length);
  local_370._M_allocated_capacity = (size_type)&local_360;
  local_370._8_8_ = 0;
  local_360._M_local_buf[0] = '\0';
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_local_buf[0] = '\0';
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  local_350._M_string_length = 0;
  local_350.field_2._M_local_buf[0] = '\0';
  iVar17 = (int)CONCAT71(in_register_00000011,current_type);
  if (iVar17 == 2) {
    bVar13 = detail::split_short(&local_308,(string *)&local_370,&local_350);
    if (!bVar13) {
      pHVar20 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar20,&local_f0);
      __cxa_throw(pHVar20,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else if (iVar17 == 4) {
    bVar13 = detail::split_windows_style(&local_308,(string *)&local_370,&local_2e8);
    if (!bVar13) {
      pHVar20 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,"windows option parsed but missing! You should not see this",
                 "");
      HorribleError::HorribleError(pHVar20,&local_110);
      __cxa_throw(pHVar20,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (iVar17 != 3) {
      pHVar20 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_130,
                 "parsing got called with invalid option! You should not see this","");
      HorribleError::HorribleError(pHVar20,&local_130);
      __cxa_throw(pHVar20,&HorribleError::typeinfo,Error::~Error);
    }
    bVar13 = detail::split_long(&local_308,(string *)&local_370,&local_2e8);
    if (!bVar13) {
      pHVar20 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1));
      HorribleError::HorribleError(pHVar20,&local_50);
      __cxa_throw(pHVar20,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var5._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var6._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_3c8 = this;
  local_178._M_allocated_capacity = (size_type)&local_168;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_370._M_allocated_capacity,
             local_370._8_8_ + local_370._M_allocated_capacity);
  local_158 = current_type;
  local_3f8 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (_Var5,_Var6,(anon_class_40_2_a297e68f_for__M_pred *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_allocated_capacity != &local_168) {
    operator_delete((void *)local_178._M_allocated_capacity,local_168._M_allocated_capacity + 1);
  }
  pAVar32 = local_3c8;
  if (local_3f8 !=
      (local_3c8->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0013ae57:
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
    pcVar4 = pbVar3[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &pbVar3[-1].field_2) {
      operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
    }
    pOVar7 = (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (((pOVar7->inject_separator_ == true) &&
        (pbVar3 = *(pointer *)
                   ((long)&(pOVar7->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   + 8),
        (pOVar7->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pbVar3)) && (pbVar3[-1]._M_string_length != 0))
    {
      local_198._8_8_ = 0;
      local_188._M_local_buf[0] = '\0';
      local_198._M_allocated_capacity = (size_type)&local_188;
      Option::_add_result(pOVar7,(string *)&local_198,&pOVar7->results_);
      pOVar7->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_allocated_capacity != &local_188) {
        operator_delete((void *)local_198._M_allocated_capacity,
                        CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) +
                        1);
      }
    }
    pOVar7 = (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((pOVar7->trigger_on_result_ == true) && (pOVar7->current_option_state_ == callback_run)) {
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&pOVar7->results_,
                        *(pointer *)
                         &(pOVar7->results_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl);
      pOVar7->current_option_state_ = parsing;
    }
    pOVar7 = (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar17 = pOVar7->type_size_min_;
    local_39c = pOVar7->expected_min_ * iVar17;
    if (iVar17 <= local_39c) {
      local_39c = iVar17;
    }
    local_3e8._0_4_ = pOVar7->type_size_max_;
    tVar14 = detail::checked_multiply<int>((int *)local_3e8,pOVar7->expected_max_);
    local_30c = 0x20000000;
    if (tVar14) {
      local_30c = (int)local_3e8._0_8_;
    }
    if ((0x1ffffff < local_30c) &&
       (pOVar7 = (local_3f8->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
       pOVar7->allow_extra_args_ == false)) {
      local_3e8._0_4_ = pOVar7->type_size_max_;
      tVar14 = detail::checked_multiply<int>((int *)local_3e8,pOVar7->expected_min_);
      local_30c = 0x20000000;
      if (tVar14) {
        local_30c = (int)local_3e8._0_8_;
      }
    }
    if (local_30c == 0) {
      pOVar7 = (local_3f8->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_1f8._M_allocated_capacity = (size_type)&local_1e8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_2e8._M_dataplus._M_p,
                 local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
      Option::get_flag_value((string *)local_3e8,pOVar7,(string *)&local_370,(string *)&local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_allocated_capacity != &local_1e8) {
        operator_delete((void *)local_1f8._M_allocated_capacity,local_1e8._M_allocated_capacity + 1)
        ;
      }
      pOVar7 = (local_3f8->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,local_3e8._0_8_,(pointer)(local_3e8._0_8_ + local_3e8._8_8_));
      Option::_add_result(pOVar7,&local_218,&pOVar7->results_);
      pOVar7->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      local_3c0._0_8_ =
           (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&pAVar32->parse_order_,
                 (Option **)local_3c0);
      if ((Option *)local_3e8._0_8_ != (Option *)(local_3e8 + 0x10)) {
        operator_delete((void *)local_3e8._0_8_,CONCAT71(local_3e8._17_7_,local_3e8[0x10]) + 1);
      }
LAB_0013b31e:
      iVar17 = 0;
    }
    else if (local_2e8._M_string_length == 0) {
      if ((char *)local_350._M_string_length == (char *)0x0) goto LAB_0013b31e;
      pOVar7 = (local_3f8->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_350._M_dataplus._M_p,
                 local_350._M_dataplus._M_p + local_350._M_string_length);
      iVar17 = Option::_add_result(pOVar7,&local_258,&pOVar7->results_);
      pAVar32 = local_3c8;
      pOVar7->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      local_3e8._0_8_ =
           (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&pAVar32->parse_order_,
                 (Option **)local_3e8);
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_350,0,(char *)local_350._M_string_length,0x1b502c);
    }
    else {
      pOVar7 = (local_3f8->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_2e8._M_dataplus._M_p,
                 local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
      iVar17 = Option::_add_result(pOVar7,&local_238,&pOVar7->results_);
      pAVar32 = local_3c8;
      pOVar7->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_3e8._0_8_ =
           (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&pAVar32->parse_order_,
                 (Option **)local_3e8);
    }
    if (iVar17 < local_39c) {
      this_00 = &local_3c8->parse_order_;
      do {
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if ((args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start == pbVar3) {
          pAVar25 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::get_name_abi_cxx11_
                    (&local_70,
                     (local_3f8->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
          Option::get_type_name_abi_cxx11_
                    (&local_90,
                     (local_3f8->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
          ArgumentMismatch::TypedAtLeast(pAVar25,&local_70,local_39c,&local_90);
          __cxa_throw(pAVar25,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        local_3e8._0_8_ = (Option *)(local_3e8 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3e8,pcVar4,pcVar4 + pbVar3[-1]._M_string_length);
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &pbVar3[-1].field_2) {
          operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
        }
        pOVar7 = (local_3f8->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_298._M_allocated_capacity = (size_type)&local_288;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_3e8._0_8_,(pointer)(local_3e8._0_8_ + local_3e8._8_8_)
                  );
        iVar18 = Option::_add_result(pOVar7,(string *)&local_298,&pOVar7->results_);
        pOVar7->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_allocated_capacity != &local_288) {
          operator_delete((void *)local_298._M_allocated_capacity,
                          local_288._M_allocated_capacity + 1);
        }
        local_3c0._0_8_ =
             (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)this_00,(Option **)local_3c0
                  );
        if ((Option *)local_3e8._0_8_ != (Option *)(local_3e8 + 0x10)) {
          operator_delete((void *)local_3e8._0_8_,CONCAT71(local_3e8._17_7_,local_3e8[0x10]) + 1);
        }
        iVar17 = iVar17 + iVar18;
      } while (iVar17 < local_39c);
    }
    iVar18 = local_30c;
    local_2c8 = local_3e8 + 0x10;
    if ((iVar17 < local_30c) ||
       (((local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
         _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
      uVar27 = 0;
      for (puVar22 = (local_3c8->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          puVar22 !=
          (local_3c8->options_).
          super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; puVar22 = puVar22 + 1) {
        pOVar7 = (puVar22->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        if (((((pOVar7->pname_)._M_string_length != 0) &&
             ((pOVar7->super_OptionBase<CLI::Option>).required_ == true)) &&
            (uVar28 = pOVar7->expected_min_ * pOVar7->type_size_min_, 0 < (int)uVar28)) &&
           (lVar30 = (long)*(pointer *)
                            ((long)&(pOVar7->results_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 8) -
                     *(long *)&(pOVar7->results_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl >> 5, (int)lVar30 < (int)uVar28)) {
          uVar27 = (uVar27 + uVar28) - lVar30;
        }
      }
      local_2c0 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&local_3c8->parse_order_;
      while (((iVar17 < iVar18 ||
              (((local_3f8->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true
              )) && ((pbVar3 = (args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start != pbVar3 &&
                     ((CVar15 = _recognize(local_3c8,(string *)(pbVar3 + -1),false), CVar15 == NONE
                      && (pbVar3 = (args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish,
                         uVar27 < (ulong)((long)pbVar3 -
                                          (long)(args->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start >> 5)))))
                    ))) {
        if (local_3c8->validate_optional_arguments_ == true) {
          local_3e8._0_8_ = local_3e8 + 0x10;
          pcVar4 = pbVar3[-1]._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3e8,pcVar4,pcVar4 + pbVar3[-1]._M_string_length);
          Option::_validate((string *)local_3c0,
                            (local_3f8->_M_t).
                            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                            .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                            (string *)local_3e8,0);
          ::std::__cxx11::string::operator=((string *)local_3e8,(string *)local_3c0);
          if ((Option *)local_3c0._0_8_ != (Option *)(local_3c0 + 0x10)) {
            operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
          }
          uVar11 = local_3e8._8_8_;
          if ((Option *)local_3e8._0_8_ != (Option *)(local_3e8 + 0x10)) {
            operator_delete((void *)local_3e8._0_8_,CONCAT71(local_3e8._17_7_,local_3e8[0x10]) + 1);
          }
          if (uVar11 != 0) break;
        }
        pOVar7 = (local_3f8->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,pcVar4,pcVar4 + pbVar3[-1]._M_string_length);
        iVar19 = Option::_add_result(pOVar7,&local_2b8,&pOVar7->results_);
        pOVar7->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        local_3e8._0_8_ =
             (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                  (local_2c0,(Option **)local_3e8);
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &pbVar3[-1].field_2) {
          operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
        }
        iVar17 = iVar17 + iVar19;
      }
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (((args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start != pbVar3) &&
         (CVar15 = _recognize(local_3c8,(string *)(pbVar3 + -1),true), CVar15 == POSITIONAL_MARK)) {
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &pbVar3[-1].field_2) {
          operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
        }
      }
      if ((0 < iVar18) && (iVar17 == 0 && local_39c == 0)) {
        local_150._M_string_length = 0;
        local_150.field_2._M_local_buf[0] = '\0';
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        Option::get_flag_value
                  ((string *)local_3e8,
                   (local_3f8->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,(string *)&local_370,
                   &local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,
                          CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                                   local_150.field_2._M_local_buf[0]) + 1);
        }
        pOVar7 = (local_3f8->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_3e8._0_8_,(pointer)(local_3e8._0_8_ + local_3e8._8_8_)
                  );
        Option::_add_result(pOVar7,&local_278,&pOVar7->results_);
        pOVar7->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        local_3c0._0_8_ =
             (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                  (local_2c0,(Option **)local_3c0);
        if ((Option *)local_3e8._0_8_ != (Option *)(local_3e8 + 0x10)) {
          operator_delete((void *)local_3e8._0_8_,CONCAT71(local_3e8._17_7_,local_3e8[0x10]) + 1);
        }
      }
    }
    if (0 < local_39c) {
      pOVar7 = (local_3f8->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      if (iVar17 % pOVar7->type_size_max_ != 0) {
        if (pOVar7->type_size_max_ == pOVar7->type_size_min_) {
          pAVar25 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
          Option::get_name_abi_cxx11_
                    (&local_b0,
                     (local_3f8->_M_t).
                     super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                     super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                     super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
          pOVar7 = (local_3f8->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
          iVar17 = pOVar7->type_size_min_;
          Option::get_type_name_abi_cxx11_(&local_d0,pOVar7);
          ArgumentMismatch::PartialType(pAVar25,&local_b0,iVar17,&local_d0);
          __cxa_throw(pAVar25,&ArgumentMismatch::typeinfo,Error::~Error);
        }
        local_1b8._8_8_ = 0;
        local_1a8._M_local_buf[0] = '\0';
        local_1b8._M_unused._M_object = &local_1a8;
        Option::_add_result(pOVar7,(string *)&local_1b8,&pOVar7->results_);
        pOVar7->current_option_state_ = parsing;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_unused._0_8_ != &local_1a8) {
          operator_delete(local_1b8._M_unused._M_object,
                          CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0])
                          + 1);
        }
      }
    }
    pOVar7 = (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar7->trigger_on_result_ == true) {
      Option::run_callback(pOVar7);
    }
    bVar13 = true;
    if ((char *)local_350._M_string_length != (char *)0x0) {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3e8,"-",&local_350);
      ::std::__cxx11::string::operator=((string *)&local_350,(string *)local_3e8);
      if ((Option *)local_3e8._0_8_ != (Option *)(local_3e8 + 0x10)) {
        operator_delete((void *)local_3e8._0_8_,CONCAT71(local_3e8._17_7_,local_3e8[0x10]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(args,&local_350);
    }
    goto LAB_0013bfaf;
  }
  psVar8 = (local_3c8->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar24 = (local_3c8->subcommands_).
                 super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_3c8 = pAVar32, psVar24 != psVar8;
      psVar24 = psVar24 + 1) {
    pAVar32 = (psVar24->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((((pAVar32->name_)._M_string_length == 0) && (pAVar32->disabled_ == false)) &&
       (bVar13 = _parse_arg(pAVar32,args,current_type,param_3), bVar13)) {
      pAVar32 = (psVar24->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      bVar13 = true;
      if (pAVar32->pre_parse_called_ == false) {
        _trigger_pre_parse(pAVar32,(long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(args->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start >> 5);
      }
      goto LAB_0013bfaf;
    }
    pAVar32 = local_3c8;
  }
  if (((current_type == SHORT) && (pAVar32->allow_non_standard_options_ != false)) &&
     (2 < local_308._M_string_length)) {
    local_3e8._0_8_ = local_3e8 + 0x10;
    local_3e8._8_8_ = 0;
    local_3e8[0x10] = '\0';
    local_3c0._8_8_ = 0;
    local_3c0._16_8_ = local_3c0._16_8_ & 0xffffffffffffff00;
    local_320._M_allocated_capacity._0_2_ = 0x2d;
    local_328 = 1;
    local_3c0._0_8_ = (Option *)(local_3c0 + 0x10);
    local_330._M_p = (pointer)&local_320;
    plVar21 = (long *)::std::__cxx11::string::_M_append
                                ((char *)&local_330,(ulong)local_308._M_dataplus._M_p);
    puVar26 = (ulong *)(plVar21 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar21 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar26) {
      local_390.field_2._M_allocated_capacity = *puVar26;
      local_390.field_2._8_8_ = plVar21[3];
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    }
    else {
      local_390.field_2._M_allocated_capacity = *puVar26;
      local_390._M_dataplus._M_p = (pointer)*plVar21;
    }
    local_390._M_string_length = plVar21[1];
    *plVar21 = (long)puVar26;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    detail::split_long(&local_390,(string *)local_3e8,(string *)local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_p != &local_320) {
      operator_delete(local_330._M_p,
                      CONCAT62(local_320._M_allocated_capacity._2_6_,
                               local_320._M_allocated_capacity._0_2_) + 1);
    }
    _Var5._M_current =
         (local_3c8->options_).
         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Var6._M_current =
         (local_3c8->options_).
         super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1d8._M_allocated_capacity = (size_type)&local_1c8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,local_3e8._0_8_,(pointer)(local_3e8._0_8_ + local_3e8._8_8_));
    local_3f8 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                ::std::
                find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                          (_Var5,_Var6,(anon_class_32_1_6b09f7e2_for__M_pred *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_allocated_capacity != &local_1c8) {
      operator_delete((void *)local_1d8._M_allocated_capacity,local_1c8._M_allocated_capacity + 1);
    }
    puVar9 = (local_3c8->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_3f8 != puVar9) {
      ::std::__cxx11::string::_M_assign((string *)local_370._M_local_buf);
      ::std::__cxx11::string::_M_assign((string *)&local_2e8);
      local_350._M_string_length = 0;
      *local_350._M_dataplus._M_p = '\0';
    }
    if ((Option *)local_3c0._0_8_ != (Option *)(local_3c0 + 0x10)) {
      operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
    }
    pAVar32 = local_3c8;
    if ((Option *)local_3e8._0_8_ != (Option *)(local_3e8 + 0x10)) {
      operator_delete((void *)local_3e8._0_8_,CONCAT71(local_3e8._17_7_,local_3e8[0x10]) + 1);
    }
    if (local_3f8 != puVar9) goto LAB_0013ae57;
  }
  if ((pAVar32->parent_ == (App *)0x0) || ((pAVar32->name_)._M_string_length != 0)) {
    uVar27 = ::std::__cxx11::string::find((char)&local_370,0x2e);
    if ((uVar27 != 0xffffffffffffffff) && (uVar27 < local_370._8_8_ - 1)) {
      ::std::__cxx11::string::substr((ulong)local_3e8,(ulong)&local_370);
      local_398 = _find_subcommand(pAVar32,(string *)local_3e8,true,false);
      if ((Option *)local_3e8._0_8_ != (Option *)(local_3e8 + 0x10)) {
        operator_delete((void *)local_3e8._0_8_,CONCAT71(local_3e8._17_7_,local_3e8[0x10]) + 1);
      }
      bVar13 = true;
      bVar31 = 1;
      if (local_398 != (App *)0x0) {
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_3e8._0_8_ = local_3e8 + 0x10;
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3e8,pcVar4,pcVar4 + pbVar3[-1]._M_string_length);
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &pbVar3[-1].field_2) {
          operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::string::substr((ulong)local_3c0,(ulong)&local_370);
        ::std::__cxx11::string::operator=((string *)local_370._M_local_buf,(string *)local_3c0);
        pOVar7 = (Option *)(local_3c0 + 0x10);
        if ((Option *)local_3c0._0_8_ != pOVar7) {
          operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
        }
        uVar11 = local_370._8_8_;
        if ((ulong)local_370._8_8_ < 2) {
          ::std::__cxx11::string::substr((ulong)local_3c0,(ulong)local_3e8);
          *(char *)local_3c0._0_8_ = '-';
          if (2 < (ulong)local_3c0._8_8_) {
            ::std::__cxx11::string::substr((ulong)&local_390,(ulong)local_3c0);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                       &local_390);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390._M_dataplus._M_p != &local_390.field_2) {
              operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::string::resize((ulong)local_3c0,'\x02');
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(args,(value_type *)local_3c0);
          if ((Option *)local_3c0._0_8_ != pOVar7) {
            operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
          }
          current_type = SHORT;
        }
        else {
          paVar2 = &local_390.field_2;
          local_390._M_dataplus._M_p = (pointer)paVar2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"--","");
          ::std::__cxx11::string::substr((ulong)&local_330,(ulong)local_3e8);
          uVar29 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != paVar2) {
            uVar29 = local_390.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar29 < local_328 + local_390._M_string_length) {
            uVar27 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_p != &local_320) {
              uVar27 = CONCAT62(local_320._M_allocated_capacity._2_6_,
                                local_320._M_allocated_capacity._0_2_);
            }
            if (uVar27 < local_328 + local_390._M_string_length) goto LAB_0013bd30;
            puVar23 = (undefined8 *)
                      ::std::__cxx11::string::replace
                                ((ulong)&local_330,0,(char *)0x0,(ulong)local_390._M_dataplus._M_p);
          }
          else {
LAB_0013bd30:
            puVar23 = (undefined8 *)
                      ::std::__cxx11::string::_M_append((char *)&local_390,(ulong)local_330._M_p);
          }
          pOVar1 = (Option *)(puVar23 + 2);
          if ((Option *)*puVar23 == pOVar1) {
            local_3c0._16_8_ = (pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
            local_3c0._24_8_ = puVar23[3];
            local_3c0._0_8_ = pOVar7;
          }
          else {
            local_3c0._16_8_ = (pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
            local_3c0._0_8_ = (Option *)*puVar23;
          }
          local_3c0._8_8_ = puVar23[1];
          *puVar23 = pOVar1;
          puVar23[1] = 0;
          *(undefined1 *)&(pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p = 0;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0)
          ;
          if ((Option *)local_3c0._0_8_ != pOVar7) {
            operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_p != &local_320) {
            operator_delete(local_330._M_p,
                            CONCAT62(local_320._M_allocated_capacity._2_6_,
                                     local_320._M_allocated_capacity._0_2_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != paVar2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
          current_type = LONG;
        }
        local_3c0._8_8_ = 0;
        local_3c0._16_8_ = local_3c0._16_8_ & 0xffffffffffffff00;
        paVar2 = &local_390.field_2;
        local_390._M_string_length = 0;
        local_390.field_2._M_allocated_capacity =
             local_390.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_390._M_dataplus._M_p = (pointer)paVar2;
        if ((((ulong)uVar11 < 2) &&
            (bVar31 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p[1],
            local_3c0._0_8_ = pOVar7, bVar31 != 0x2d && 0x21 < bVar31)) ||
           (local_3c0._0_8_ = pOVar7,
           bVar16 = detail::split_long((string *)
                                       ((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish + -1),
                                       (string *)local_3c0,&local_390), bVar16)) {
          bVar16 = _parse_arg(local_398,args,current_type,true);
        }
        else {
          bVar16 = false;
        }
        if (bVar16 == false) {
          pbVar3 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
          pcVar4 = pbVar3[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &pbVar3[-1].field_2) {
            operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(args,(value_type *)local_3e8);
        }
        else {
          if (local_398->silent_ == false) {
            std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                      (&local_3c8->parsed_subcommands_,&local_398);
          }
          increment_parsed(local_3c8);
          _trigger_pre_parse(local_3c8,
                             (long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(args->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 5);
          if ((local_398->parse_complete_callback_).super__Function_base._M_manager !=
              (_Manager_type)0x0) {
            _process_env(local_398);
            _process_callbacks(local_398);
            _process_help_flags(local_398,false,false);
            _process_requirements(local_398);
            run_callback(local_398,false,true);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != paVar2) {
          operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
        }
        if ((Option *)local_3c0._0_8_ != pOVar7) {
          operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
        }
        if ((Option *)local_3e8._0_8_ != (Option *)(local_3e8 + 0x10)) {
          operator_delete((void *)local_3e8._0_8_,CONCAT71(local_3e8._17_7_,local_3e8[0x10]) + 1);
        }
        bVar31 = bVar16 ^ 1;
      }
      if (bVar31 == 0) goto LAB_0013bfaf;
    }
    pAVar32 = local_3c8;
    if (!param_3) {
      if ((local_3c8->parent_ == (App *)0x0) ||
         (pAVar12 = local_3c8->parent_, local_3c8->fallthrough_ != true)) {
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
        pcVar4 = pbVar3[-1]._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &pbVar3[-1].field_2) {
          operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
        }
        local_3e8[0] = current_type;
        if (pAVar32->allow_extras_ == false) {
          psVar24 = (pAVar32->subcommands_).
                    super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar8 = (pAVar32->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (psVar24 != psVar8) {
            bVar13 = false;
            do {
              peVar10 = (psVar24->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              if (((peVar10->name_)._M_string_length == 0) && (peVar10->allow_extras_ == true)) {
                ::std::
                vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                          ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                            *)&peVar10->missing_,local_3e8,&local_308);
                if (!bVar13) goto LAB_0013c123;
                break;
              }
              psVar24 = psVar24 + 1;
              bVar13 = psVar24 == psVar8;
            } while (!bVar13);
          }
        }
        ::std::
        vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                  ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                    *)&pAVar32->missing_,local_3e8,&local_308);
LAB_0013c123:
        bVar13 = true;
      }
      else {
        do {
          pAVar32 = pAVar12;
          if (pAVar32->parent_ == (App *)0x0) break;
          pAVar12 = pAVar32->parent_;
        } while ((pAVar32->name_)._M_string_length == 0);
        bVar13 = _parse_arg(pAVar32,args,current_type,false);
      }
      goto LAB_0013bfaf;
    }
  }
  bVar13 = false;
LAB_0013bfaf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,
                    CONCAT71(local_350.field_2._M_allocated_capacity._1_7_,
                             local_350.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,
                    CONCAT71(local_2e8.field_2._M_allocated_capacity._1_7_,
                             local_2e8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_allocated_capacity != &local_360) {
    operator_delete((void *)local_370._M_allocated_capacity,
                    CONCAT71(local_360._M_allocated_capacity._1_7_,local_360._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  return bVar13;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos && dotloc < arg_name.size() - 1) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                std::string dummy1, dummy2;
                bool val = false;
                if((current_type == detail::Classifier::SHORT && detail::valid_first_char(args.back()[1])) ||
                   detail::split_long(args.back(), dummy1, dummy2)) {
                    val = sub->_parse_arg(args, current_type, true);
                }

                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}